

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall
QTextDocument::setMetaInformation(QTextDocument *this,MetaInformation info,QString *string)

{
  QTextDocumentPrivate *pQVar1;
  QString *in_RDX;
  undefined4 in_ESI;
  QTextDocumentPrivate *d;
  
  pQVar1 = d_func((QTextDocument *)0x7ac410);
  switch(in_ESI) {
  case 0:
    QString::operator=(&pQVar1->title,in_RDX);
    break;
  case 1:
    QString::operator=(&pQVar1->url,in_RDX);
    break;
  case 2:
    QString::operator=(&pQVar1->cssMedia,in_RDX);
    break;
  case 3:
    QString::operator=(&pQVar1->frontMatter,in_RDX);
  }
  return;
}

Assistant:

void QTextDocument::setMetaInformation(MetaInformation info, const QString &string)
{
    Q_D(QTextDocument);
    switch (info) {
    case DocumentTitle:
        d->title = string;
        break;
    case DocumentUrl:
        d->url = string;
        break;
    case CssMedia:
        d->cssMedia = string;
        break;
    case FrontMatter:
        d->frontMatter = string;
        break;
    }
}